

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

void __thiscall
TStokesAnalytic::pressure<Fad<Fad<double>>>
          (TStokesAnalytic *this,TPZVec<Fad<Fad<double>_>_> *x,FADFADSTATE *p)

{
  FADFADSTATE *pFVar1;
  double dVar2;
  double dVar3;
  Fad<Fad<double>_> *pFVar4;
  undefined1 local_c68 [16];
  undefined8 uStack_c58;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *local_c50;
  double dStack_c48;
  int local_c40;
  Fad<double> *local_c38;
  double dStack_c30;
  int local_c28;
  double *local_c20;
  double dStack_c18;
  undefined1 local_c10 [24];
  FADFADSTATE *local_bf8;
  undefined1 local_bb8 [24];
  Fad<Fad<double>_> *local_ba0;
  FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> local_b98;
  undefined1 local_b80 [24];
  Fad<Fad<double>_> *local_b68;
  undefined1 local_b60 [24];
  Fad<Fad<double>_> *local_b48;
  REAL local_b08;
  undefined1 local_b00 [24];
  undefined1 local_ae8 [24];
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>
  local_ad0;
  undefined1 local_ac0 [16];
  TPZVec<Fad<Fad<double>_>_> flux;
  undefined1 local_a90 [24];
  FADFADSTATE *local_a78;
  FADFADSTATE x2;
  FADFADSTATE x1;
  FADFADSTATE fadRa;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>
  local_930;
  FADFADSTATE local_920;
  FADFADSTATE local_8c8;
  FADFADSTATE local_870;
  FADFADSTATE local_818;
  FADFADSTATE local_7c0;
  FADFADSTATE local_768;
  FADFADSTATE local_710;
  FADFADSTATE local_6b8;
  FADFADSTATE local_660;
  Fad<Fad<double>_> local_608;
  Fad<Fad<double>_> local_5b0;
  Fad<Fad<double>_> local_558;
  Fad<Fad<double>_> local_500;
  FADFADSTATE local_4a8;
  FADFADSTATE local_450;
  FADFADSTATE local_3f8;
  FADFADSTATE local_3a0;
  FADFADSTATE local_348;
  Fad<Fad<double>_> local_2f0;
  Fad<Fad<double>_> local_298;
  Fad<Fad<double>_> local_240;
  Fad<Fad<double>_> local_1e8;
  FADFADSTATE local_190;
  Fad<Fad<double>_> local_138;
  Fad<Fad<double>_> local_e0;
  FADFADSTATE x3;
  
  Fad<Fad<double>_>::Fad(&x1,x->fStore);
  Fad<Fad<double>_>::Fad(&x2,x->fStore + 1);
  Fad<Fad<double>_>::Fad(&x3,x->fStore + 2);
  fadRa.val_.val_ = 0.0;
  fadRa.val_.dx_.num_elts = 0;
  fadRa.defaultVal.dx_.ptr_to_data = (double *)0x0;
  fadRa.defaultVal.defaultVal = 0.0;
  fadRa.val_.dx_.ptr_to_data = (double *)0x0;
  fadRa.val_.defaultVal = 0.0;
  fadRa.dx_.num_elts = 0;
  fadRa.dx_.ptr_to_data = (Fad<double> *)0x0;
  fadRa.defaultVal.val_ = 0.0;
  fadRa.defaultVal.dx_.num_elts = 0;
  TPZVec<Fad<Fad<double>_>_>::TPZVec(&flux,3,&fadRa);
  Fad<Fad<double>_>::~Fad(&fadRa);
  dVar2 = x2.val_.val_;
  fadRa.val_.val_ = this->multRa;
  fadRa.val_.dx_.num_elts = 0;
  fadRa.defaultVal.dx_.ptr_to_data = (double *)0x0;
  fadRa.defaultVal.defaultVal = 0.0;
  fadRa.dx_.num_elts = 0;
  fadRa.val_.dx_.ptr_to_data = (double *)0x0;
  fadRa.val_.defaultVal = 0.0;
  fadRa.defaultVal.dx_.num_elts = 0;
  fadRa.dx_.ptr_to_data = (Fad<double> *)0x0;
  fadRa.defaultVal.val_ = 0.0;
  switch(this->fExactSol) {
  case EKovasznay:
    dVar3 = 1.0 / this->fvisco;
    dVar2 = this->Pi * 4.0 * this->Pi + dVar3 * dVar3 * 0.25;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar2 = dVar3 * 0.5 - dVar2;
    local_b60._8_8_ = dVar2 + dVar2;
    local_b60._16_8_ = (Fad<double> *)0x0;
    local_b48 = &x1;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_768,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b60);
    FADexp((FADFADSTATE *)local_c68,&local_768);
    local_c10._8_8_ = (undefined1 *)0xbfe0000000000000;
    local_c10._16_8_ = 0.0;
    local_bf8 = (FADFADSTATE *)local_c68;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_c10);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    pFVar4 = &local_768;
    break;
  case EKovasznayCDG:
    dVar3 = 1.0 / this->fvisco;
    dVar2 = this->Pi * 4.0 * this->Pi + dVar3 * dVar3 * 0.25;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    pFVar4 = (Fad<Fad<double>_> *)(dVar3 * 0.5 - dVar2);
    local_a90._16_8_ = (double *)0x0;
    local_a90._8_8_ = pFVar4;
    local_a78 = &x1;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_7c0,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_a90);
    FADexp((FADFADSTATE *)local_c68,&local_7c0);
    local_b80._8_8_ = this->Pi + this->Pi;
    local_b80._16_8_ = (double *)0x0;
    local_b68 = &x2;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_818,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b80);
    FADcos((FADFADSTATE *)local_c10,&local_818);
    local_b48 = (Fad<Fad<double>_> *)local_bb8;
    local_b60._8_8_ = (Fad<Fad<double>_> *)0x3ff0000000000000;
    local_b60._16_8_ = (Fad<double> *)0x0;
    local_bb8._0_8_ = (FADFADSTATE *)local_c68;
    local_bb8._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)flux.fStore,
               (FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)local_b60);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
    Fad<Fad<double>_>::~Fad(&local_818);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    Fad<Fad<double>_>::~Fad(&local_7c0);
    local_b08 = this->Pi;
    local_a90._16_8_ = (double *)0x0;
    local_a90._8_8_ = pFVar4;
    local_a78 = &x1;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_870,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_a90);
    FADexp((FADFADSTATE *)local_c68,&local_870);
    local_b60._8_8_ = (double)pFVar4 / (local_b08 + local_b08);
    local_b60._16_8_ = (Fad<double> *)0x0;
    local_b80._8_8_ = this->Pi + this->Pi;
    local_b80._16_8_ = (double *)0x0;
    local_b68 = &x2;
    local_b48 = (FADFADSTATE *)local_c68;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_8c8,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b80);
    FADsin((FADFADSTATE *)local_c10,&local_8c8);
    local_bb8._0_8_ = (FADFADSTATE *)local_b60;
    local_bb8._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)(flux.fStore + 1),
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)local_bb8);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
    Fad<Fad<double>_>::~Fad(&local_8c8);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    Fad<Fad<double>_>::~Fad(&local_870);
    local_b60._8_8_ = (double)pFVar4 + (double)pFVar4;
    local_b60._16_8_ = (Fad<double> *)0x0;
    local_b48 = &x1;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_920,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b60);
    FADexp((FADFADSTATE *)local_c68,&local_920);
    local_c10._8_8_ = -0.5;
    local_c10._16_8_ = 0.0;
    local_bf8 = (FADFADSTATE *)local_c68;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_c10);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    Fad<Fad<double>_>::~Fad(&local_920);
    local_b60._0_8_ = flux.fStore;
    local_b60._8_8_ = flux.fStore;
    local_a90._0_8_ = flux.fStore + 1;
    local_c10._8_8_ = local_a90;
    local_c68._8_8_ = 0.5;
    uStack_c58 = 0.0;
    local_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_c10;
    local_c10._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b60;
    local_a90._8_8_ = local_a90._0_8_;
    Fad<Fad<double>>::operator+=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>_>_>
                *)local_c68);
    goto LAB_0120b5ab;
  case ESinCos:
  case ESinCosBDS:
    Fad<Fad<double>_>::Fad(&local_e0,&x1);
    FADcos((FADFADSTATE *)local_c68,&local_e0);
    Fad<Fad<double>_>::Fad(&local_138,&x2);
    FADsin((FADFADSTATE *)local_c10,&local_138);
    local_b60._0_8_ = (FADFADSTATE *)local_c68;
    local_b60._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)local_b60);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
    Fad<Fad<double>_>::~Fad(&local_138);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    pFVar4 = &local_e0;
    break;
  case ENoFlow:
    Fad<Fad<double>_>::Fad((Fad<Fad<double>_> *)local_c68,&fadRa);
    local_b00._0_8_ = &local_b98;
    local_bb8._0_8_ = local_b00;
    local_b60._0_8_ = local_ae8;
    local_bb8._8_8_ = local_b60;
    local_b60._8_8_ = (FADFADSTATE *)0x4000000000000000;
    local_b60._16_8_ = (Fad<double> *)0x0;
    local_b80._0_8_ = local_bb8;
    local_c10._0_8_ = local_b80;
    local_a90._8_8_ = local_c10;
    local_c10._8_8_ = (undefined1 *)0x3fe2aaaaaaaaaaab;
    local_c10._16_8_ = 0.0;
    local_b98.fadexpr_.left_ = &x2;
    local_b98.fadexpr_.right_.constant_ = (double)&x2;
    local_b80._8_8_ = &x2;
    local_b00._8_8_ = &x2;
    local_ae8._0_8_ = &x2;
    local_ae8._8_8_ = &x2;
    local_a90._0_8_ = (Fad<Fad<double>_> *)local_c68;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>
                *)local_a90);
    pFVar4 = (Fad<Fad<double>_> *)local_c68;
    break;
  case ESinCos3D:
  case ESinCosBDS3D:
    Fad<Fad<double>_>::Fad(&local_500,&x1);
    FADcos((FADFADSTATE *)local_c68,&local_500);
    Fad<Fad<double>_>::Fad(&local_558,&x2);
    FADsin((FADFADSTATE *)local_c10,&local_558);
    local_bb8._0_8_ = (FADFADSTATE *)local_c68;
    local_bb8._8_8_ = (FADFADSTATE *)local_c10;
    Fad<Fad<double>_>::Fad(&local_5b0,&x2);
    FADcos((Fad<Fad<double>_> *)local_b60,&local_5b0);
    Fad<Fad<double>_>::Fad(&local_608,&x3);
    FADsin((FADFADSTATE *)local_a90,&local_608);
    local_b80._8_8_ = local_b00;
    local_b80._0_8_ = local_bb8;
    local_b00._0_8_ = (Fad<Fad<double>_> *)local_b60;
    local_b00._8_8_ = (FADFADSTATE *)local_a90;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>
                *)local_b80);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_a90);
    Fad<Fad<double>_>::~Fad(&local_608);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_b60);
    Fad<Fad<double>_>::~Fad(&local_5b0);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
    Fad<Fad<double>_>::~Fad(&local_558);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    pFVar4 = &local_500;
    break;
  case EPconst:
    local_c68._0_4_ = 0;
    Fad<Fad<double>_>::operator=<int,_nullptr>(p,(int *)local_c68);
    goto LAB_0120b5ab;
  default:
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZAnalyticSolution.cpp"
               ,0x988);
  case EGatica3D:
    local_a90._8_8_ = this->Pi;
    local_a90._16_8_ = (double *)0x0;
    local_a78 = &x1;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_660,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_a90);
    FADsin((FADFADSTATE *)local_c68,&local_660);
    local_b80._8_8_ = this->Pi;
    local_b80._16_8_ = (double *)0x0;
    local_b68 = &x2;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_6b8,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b80);
    FADsin((FADFADSTATE *)local_c10,&local_6b8);
    local_bb8._8_8_ = this->Pi;
    local_bb8._16_8_ = 0.0;
    local_ba0 = &x3;
    local_b98.fadexpr_.left_ = (FADFADSTATE *)local_c68;
    local_b98.fadexpr_.right_.constant_ = (double)local_c10;
    Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
              ((Fad<Fad<double>> *)&local_710,
               (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_bb8);
    FADsin((FADFADSTATE *)local_b60,&local_710);
    local_b00._0_8_ = &local_b98;
    local_b00._8_8_ = (FADFADSTATE *)local_b60;
    Fad<Fad<double>>::operator=
              ((Fad<Fad<double>> *)p,
               (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)local_b00);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_b60);
    Fad<Fad<double>_>::~Fad(&local_710);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
    Fad<Fad<double>_>::~Fad(&local_6b8);
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    pFVar4 = &local_660;
    break;
  case ECouplingSD:
    local_c68._8_8_ = 0.0;
    uStack_c58 = (double)((ulong)uStack_c58._4_4_ << 0x20);
    local_c20 = (double *)0x0;
    dStack_c18 = 0.0;
    local_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
    dStack_c48 = 0.0;
    local_c40 = 0;
    local_c38 = (Fad<double> *)0x0;
    dStack_c30 = 0.0;
    local_c28 = 0;
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    if (0.0 <= dVar2) {
      local_c68._8_8_ = 0.0;
      uStack_c58 = (double)((ulong)uStack_c58 & 0xffffffff00000000);
      local_c20 = (double *)0x0;
      dStack_c18 = 0.0;
      local_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
      dStack_c48 = 0.0;
      local_c40 = 0;
      local_c38 = (Fad<double> *)0x0;
      dStack_c30 = 0.0;
      local_c28 = 0;
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
      if (x2.val_.val_ < 0.0) goto LAB_0120b5ab;
      Fad<Fad<double>_>::Fad(&local_298,&x1);
      FADsin((FADFADSTATE *)local_c68,&local_298);
      Fad<Fad<double>_>::Fad(&local_2f0,&x2);
      FADsin((FADFADSTATE *)local_c10,&local_2f0);
      local_b60._0_8_ = (FADFADSTATE *)local_c68;
      local_b60._8_8_ = (FADFADSTATE *)local_c10;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)local_b60);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
      Fad<Fad<double>_>::~Fad(&local_2f0);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
      pFVar4 = &local_298;
    }
    else {
      local_b00._0_8_ = &x2;
      Fad<Fad<double>>::Fad<FadUnaryMin<Fad<Fad<double>>>>
                ((Fad<Fad<double>> *)&local_190,
                 (FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_> *)local_b00);
      FADexp((FADFADSTATE *)local_c68,&local_190);
      local_bb8._0_8_ = (FADFADSTATE *)local_c68;
      Fad<Fad<double>_>::Fad(&local_1e8,&x2);
      FADexp((FADFADSTATE *)local_c10,&local_1e8);
      local_b80._0_8_ = local_bb8;
      local_b80._8_8_ = (FADFADSTATE *)local_c10;
      Fad<Fad<double>_>::Fad(&local_240,&x1);
      FADsin((FADFADSTATE *)local_b60,&local_240);
      local_a90._0_8_ = local_b80;
      local_a90._8_8_ = (FADFADSTATE *)local_b60;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)local_a90);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_b60);
      Fad<Fad<double>_>::~Fad(&local_240);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
      Fad<Fad<double>_>::~Fad(&local_1e8);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
      pFVar4 = &local_190;
    }
    break;
  case ECouplingNSD:
    local_c68._8_8_ = 1.0;
    uStack_c58 = (double)((ulong)uStack_c58._4_4_ << 0x20);
    local_c20 = (double *)0x0;
    dStack_c18 = 0.0;
    local_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
    dStack_c48 = 0.0;
    local_c40 = 0;
    local_c38 = (Fad<double> *)0x0;
    dStack_c30 = 0.0;
    local_c28 = 0;
    Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
    if (1.0 <= dVar2) {
      local_c68._8_8_ = 1.0;
      uStack_c58 = (double)((ulong)uStack_c58 & 0xffffffff00000000);
      local_c20 = (double *)0x0;
      dStack_c18 = 0.0;
      local_c50 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)0x0;
      dStack_c48 = 0.0;
      local_c40 = 0;
      local_c38 = (Fad<double> *)0x0;
      dStack_c30 = 0.0;
      local_c28 = 0;
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
      if (x2.val_.val_ < 1.0) goto LAB_0120b5ab;
      pFVar1 = (FADFADSTATE *)this->Pi;
      local_b00._0_8_ = local_b80;
      local_b80._16_8_ = (double *)0x0;
      local_b00._8_8_ = (Fad<Fad<double>_> *)0x4000000000000000;
      local_b00._16_8_ = 0.0;
      local_b80._8_8_ = pFVar1;
      local_b68 = &x1;
      Fad<Fad<double>>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>,FadCst<double>>>
                ((Fad<Fad<double>> *)&local_3f8,
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)local_b00);
      FADcos((FADFADSTATE *)local_c68,&local_3f8);
      local_a90._8_8_ = (double)pFVar1 * 0.25;
      local_a90._16_8_ = (double *)0x0;
      local_b98.fadexpr_.right_.constant_ = 1.0;
      local_b98.fadexpr_.right_.defaultVal = 0.0;
      local_bb8._8_8_ = this->Pi;
      local_bb8._16_8_ = 0.0;
      local_ba0 = &x2;
      local_b98.fadexpr_.left_ = &x2;
      local_a78 = (FADFADSTATE *)local_c68;
      Fad<Fad<double>>::Fad<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>
                ((Fad<Fad<double>> *)&local_450,
                 (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_bb8);
      FADcos((FADFADSTATE *)local_c10,&local_450);
      local_930.fadexpr_.left_ = &local_b98;
      local_ad0.fadexpr_.right_ = &local_930;
      local_ad0.fadexpr_.left_ =
           (FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_a90;
      local_ae8._8_8_ = (FADFADSTATE *)0x3ff0000000000000;
      local_ae8._16_8_ = 0.0;
      local_ae8._0_8_ = &x2;
      local_930.fadexpr_.right_ = (FADFADSTATE *)local_c10;
      Fad<Fad<double>>::Fad<FadBinaryMinus<Fad<Fad<double>>,FadCst<double>>>
                ((Fad<Fad<double>> *)&local_4a8,
                 (FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_> *)local_ae8);
      FADsin((FADFADSTATE *)local_b60,&local_4a8);
      local_ac0._0_8_ = &local_ad0;
      local_ac0._8_8_ = (FADFADSTATE *)local_b60;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)local_ac0);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_b60);
      Fad<Fad<double>_>::~Fad(&local_4a8);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
      Fad<Fad<double>_>::~Fad(&local_450);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
      pFVar4 = &local_3f8;
    }
    else {
      local_b60._8_8_ = this->Pi;
      local_bb8._0_8_ = local_b60;
      local_b60._16_8_ = (Fad<double> *)0x0;
      local_ac0._0_8_ = local_bb8;
      local_bb8._8_8_ = (FADFADSTATE *)0x4010000000000000;
      local_bb8._16_8_ = 0.0;
      local_b00._0_8_ = local_a90;
      local_a90._16_8_ = (double *)0x0;
      local_b00._8_8_ = (Fad<Fad<double>_> *)0x4000000000000000;
      local_b00._16_8_ = 0.0;
      local_b48 = &x2;
      local_a90._8_8_ = local_b60._8_8_;
      local_a78 = &x1;
      Fad<Fad<double>>::
      Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,Fad<Fad<double>>>>,FadCst<double>>>
                ((Fad<Fad<double>> *)&local_348,
                 (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>
                  *)local_b00);
      FADcos((FADFADSTATE *)local_c68,&local_348);
      local_ae8._0_8_ = local_ac0;
      local_b80._8_8_ = (FADFADSTATE *)0x3ff0000000000000;
      local_b80._16_8_ = (double *)0x0;
      local_b68 = &x2;
      local_ae8._8_8_ = (FADFADSTATE *)local_c68;
      Fad<Fad<double>>::Fad<FadBinaryMinus<FadCst<double>,Fad<Fad<double>>>>
                ((Fad<Fad<double>> *)&local_3a0,
                 (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)local_b80);
      FADsin((FADFADSTATE *)local_c10,&local_3a0);
      local_b98.fadexpr_.left_ = (Fad<Fad<double>_> *)local_ae8;
      local_b98.fadexpr_.right_.constant_ = (double)local_c10;
      Fad<Fad<double>>::operator=
                ((Fad<Fad<double>> *)p,
                 (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                  *)&local_b98);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c10);
      Fad<Fad<double>_>::~Fad(&local_3a0);
      Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)local_c68);
      pFVar4 = &local_348;
    }
  }
  Fad<Fad<double>_>::~Fad(pFVar4);
LAB_0120b5ab:
  Fad<Fad<double>_>::~Fad(&fadRa);
  TPZVec<Fad<Fad<double>_>_>::~TPZVec(&flux);
  Fad<Fad<double>_>::~Fad(&x3);
  Fad<Fad<double>_>::~Fad(&x2);
  Fad<Fad<double>_>::~Fad(&x1);
  return;
}

Assistant:

void TStokesAnalytic::pressure(const TPZVec<FADFADSTATE > &x, FADFADSTATE &p) const
{
    FADFADSTATE x1 = x[0];
    FADFADSTATE x2 = x[1];
    FADFADSTATE x3 = x[2];
    TPZVec<FADFADSTATE > flux(3,0.);
    REAL Re = 0.;
    REAL lambda = 0.;
    FADFADSTATE fadRa = multRa;    

    switch(fExactSol)
    {
        case ESinCos:
        case ESinCosBDS:
            p = FADcos(x1)*FADsin(x2);
            break;
        case ENoFlow:
            p = (FADFADSTATE) fadRa*(x2*x2*x2-(x2*x2)/2.+x2-7./12.);
            break;
	case ECouplingSD:
	    if(x2< (FADFADSTATE) 0.){
		p = (-FADexp(-x2)+FADexp(x2))*FADsin(x1);		
	    }else if(x2>= (FADFADSTATE) 0.){
		p = FADsin(x1)*FADsin(x2);
	    }
	    break;
	case ECouplingNSD:
	    if(x2< (FADFADSTATE)1.){
		p = -(Pi*x2/4.)*FADcos(Pi*x1/2.)*FADsin(1.-x2);		
	    }else if(x2>= (FADFADSTATE)1.){
                p = (Pi/4.)*FADcos(Pi*x1/2.)*(x2-1.-FADcos(Pi*x2))*FADsin(x2-1.);
	    }
	    break;
        case ESinCos3D:
        case ESinCosBDS3D:
            p = FADcos(x1)*FADsin(x2)+FADcos(x2)*FADsin(x3);
            break;
        case EGatica3D:
            p = FADsin(Pi*x1)*FADsin(Pi*x2)*FADsin(Pi*x3);
            break;
        case EKovasznay:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            p = -(1./2.)*FADexp(2.*lambda*x1);
            break;
        case EKovasznayCDG:
	    Re = 1./fvisco; //Reynolds number
            lambda = Re/2.- sqrt(Re*Re/4.+4.*Pi*Pi); // Parameter for Navier-Stokes solution
            flux[0] = 1. - FADexp(lambda*x1)*FADcos(2.*Pi*x2);
            flux[1] = (lambda/(2.*Pi))*FADexp(lambda*x1)*FADsin(2.*Pi*x2);
            p = -(1./2.)*FADexp(2.*lambda*x1);
            p += (1./2.)*(flux[0]*flux[0]+flux[1]*flux[1]);
            break;
        case EPconst:
            p = 0;
            break;
        default:
            DebugStop();
    }
    
}